

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O0

void __thiscall QGraphicsSceneIndex::clear(QGraphicsSceneIndex *this)

{
  QList<QGraphicsItem_*> *this_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  QList<QGraphicsItem_*> allItems;
  qsizetype in_stack_ffffffffffffffb8;
  int local_2c;
  QList<QGraphicsItem_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*in_RDI + 0x60))(&local_20,in_RDI,1);
  local_2c = 0;
  while( true ) {
    this_00 = (QList<QGraphicsItem_*> *)(long)local_2c;
    qVar1 = QList<QGraphicsItem_*>::size(&local_20);
    if (qVar1 <= (long)this_00) break;
    ppQVar2 = QList<QGraphicsItem_*>::at(this_00,in_stack_ffffffffffffffb8);
    (**(code **)(*in_RDI + 0xb8))(in_RDI,*ppQVar2);
    local_2c = local_2c + 1;
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa280f9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneIndex::clear()
{
    const QList<QGraphicsItem *> allItems = items();
    for (int i = 0 ; i < allItems.size(); ++i)
        removeItem(allItems.at(i));
}